

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O2

chunk_conflict * swamp_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  short sVar1;
  short sVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  chunk *c;
  feature *pfVar7;
  char **ppcVar8;
  wchar_t *pwVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  loc grid;
  loc lVar14;
  loc_conflict grid_00;
  wchar_t form_feats [7];
  
  sVar1 = p->place;
  sVar2 = p->last_place;
  form_feats[0] = FEAT_TREE;
  form_feats[1] = FEAT_PASS_RUBBLE;
  form_feats[2] = FEAT_MAGMA;
  form_feats[3] = FEAT_GRANITE;
  form_feats[4] = FEAT_TREE2;
  form_feats[5] = FEAT_QUARTZ;
  form_feats[6] = FEAT_NONE;
  ppcVar8 = p_error;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = (int)sVar1;
  lVar11 = 0;
  for (lVar13 = 0; lVar13 < c->height; lVar13 = lVar13 + 1) {
    for (lVar12 = 0; lVar12 < c->width; lVar12 = lVar12 + 1) {
      square_set_feat((chunk_conflict *)c,(loc)(lVar11 + lVar12),FEAT_GRASS);
    }
    lVar11 = lVar11 + 0x100000000;
  }
  alloc_paths((chunk_conflict *)c,(player *)(ulong)(uint)(int)sVar1,(int)sVar2,(wchar_t)ppcVar8);
  set_num_vaults((chunk_conflict *)c);
  make_edges((chunk_conflict *)c,true,false);
  lVar14.x = L'\x02';
  lVar14.y = L'\x01';
  for (lVar11 = 1; lVar11 < (long)c->height + -1; lVar11 = lVar11 + 1) {
    grid = lVar14;
    for (lVar13 = 2; lVar13 < (long)c->width + -1; lVar13 = lVar13 + 1) {
      pfVar7 = square_feat((chunk_conflict *)c,grid);
      _Var3 = feat_is_permanent(pfVar7->fidx);
      if (!_Var3) {
        _Var3 = loc_eq(p->grid,(loc_conflict)grid);
        pwVar9 = &FEAT_GRASS;
        if (!_Var3) {
          uVar4 = Rand_div(100);
          pwVar9 = &FEAT_WATER;
          if ((int)uVar4 < 0x32) {
            pwVar9 = &FEAT_GRASS;
          }
        }
        square_set_feat((chunk_conflict *)c,grid,*pwVar9);
      }
      grid = (loc)((long)grid + 1);
    }
    lVar14 = (loc)((long)lVar14 + 0x100000000);
  }
  for (iVar10 = 0; iVar10 < (int)(20000 / (long)c->depth); iVar10 = iVar10 + wVar6) {
    uVar4 = Rand_div(c->height + L'\xfffffffe');
    uVar5 = Rand_div(c->width + L'\xfffffffe');
    grid_00.y = uVar4 + 1;
    grid_00.x = uVar5 + 1;
    wVar6 = make_formation((chunk_conflict *)c,p,grid_00,FEAT_GRASS,FEAT_WATER,form_feats,"Swamp",
                           c->depth);
  }
  lVar11 = 0;
  for (lVar13 = 0; lVar13 < c->height; lVar13 = lVar13 + 1) {
    for (lVar12 = 0; lVar12 < c->width; lVar12 = lVar12 + 1) {
      square_unmark((chunk_conflict *)c,(loc)(lVar11 + lVar12));
    }
    lVar11 = lVar11 + 0x100000000;
  }
  populate((chunk_conflict *)c,false);
  _Var3 = verify_level((chunk_conflict *)c);
  if (!_Var3) {
    wipe_mon_list(c,p);
    cave_free((chunk_conflict *)c);
    *p_error = "wilderness level had generation issues";
    c = (chunk *)0x0;
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *swamp_gen(struct player *p, int height, int width,
						const char **p_error)
{
	struct loc grid;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;

	int form_feats[] = { FEAT_TREE, FEAT_PASS_RUBBLE, FEAT_MAGMA, FEAT_GRANITE,
						 FEAT_TREE2, FEAT_QUARTZ, FEAT_NONE };

    /* Make the level */
    struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;

	/* Start with grass */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Place 2 or 3 paths to neighbouring places, place player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, true, false);

	/* Add water */
	for (grid.y = 1; grid.y < c->height - 1; grid.y++) {
		for (grid.x = 2; grid.x < c->width - 1; grid.x++) {
			if (feat_is_permanent(square_feat(c, grid)->fidx))
				continue;
			if (loc_eq(p->grid, grid) || (randint0(100) < 50)) {
				square_set_feat(c, grid, FEAT_GRASS);
			} else {
				square_set_feat(c, grid, FEAT_WATER);
			}
		}
	}

	/* Place some formations (but not many, and less for more danger) */
	while (form_grids < 20000 / c->depth) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);
		form_grids += make_formation(c, p, grid, FEAT_GRASS, FEAT_WATER,
									 form_feats, "Swamp", c->depth);
	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}